

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitcoin-cli.cpp
# Opt level: O2

UniValue * __thiscall
NetinfoRequestHandler::ProcessReply
          (UniValue *__return_storage_ptr__,NetinfoRequestHandler *this,UniValue *batch_in)

{
  unsigned_short *puVar1;
  uint8_t uVar2;
  char cVar3;
  VType VVar4;
  long lVar5;
  pointer pPVar6;
  long lVar7;
  pointer pUVar8;
  UniValue result_00;
  UniValue error;
  optional<UniValue> id;
  pointer pcVar9;
  int8_t iVar10;
  bool bVar11;
  bool bVar12;
  int iVar13;
  UniValue *pUVar14;
  UniValue *pUVar15;
  long lVar16;
  vector<UniValue,_std::allocator<UniValue>_> *pvVar17;
  string *psVar18;
  reference pvVar19;
  reference pvVar20;
  long lVar21;
  undefined7 extraout_var;
  const_reference fmt;
  ulong uVar22;
  runtime_error *this_00;
  pointer pcVar23;
  char (*args) [2];
  size_t i;
  pointer __str;
  pointer pUVar24;
  const_iterator __end2;
  UniValue *network_1;
  size_type sVar25;
  pointer pcVar26;
  long in_FS_OFFSET;
  char *pcVar27;
  char **args_4;
  NetinfoRequestHandler *pNVar28;
  pointer pUVar29;
  int in_stack_fffffffffffffa90;
  undefined4 in_stack_fffffffffffffa94;
  double in_stack_fffffffffffffa98;
  double in_stack_fffffffffffffaa0;
  undefined4 in_stack_fffffffffffffab0;
  undefined4 in_stack_fffffffffffffab4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_14;
  undefined1 in_stack_fffffffffffffac0;
  undefined7 in_stack_fffffffffffffac1;
  undefined1 in_stack_fffffffffffffac8;
  undefined7 in_stack_fffffffffffffac9;
  pointer pUVar30;
  uint8_t *args_15;
  int in_stack_fffffffffffffae0;
  undefined4 in_stack_fffffffffffffae4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_18;
  uint8_t *args_19;
  array<unsigned_short,_8UL> *this_01;
  vector<NetinfoRequestHandler::Peer,_std::allocator<NetinfoRequestHandler::Peer>_> *this_02;
  pointer in_stack_fffffffffffffb20;
  long in_stack_fffffffffffffb28;
  long in_stack_fffffffffffffb30;
  long in_stack_fffffffffffffb38;
  undefined8 in_stack_fffffffffffffb40;
  size_t in_stack_fffffffffffffb48;
  undefined8 in_stack_fffffffffffffb50;
  undefined4 in_stack_fffffffffffffb58;
  undefined4 in_stack_fffffffffffffb5c;
  size_type in_stack_fffffffffffffb60;
  undefined8 in_stack_fffffffffffffb68;
  undefined8 in_stack_fffffffffffffb70;
  undefined8 in_stack_fffffffffffffb78;
  long in_stack_fffffffffffffb80;
  allocator<char> local_471;
  long local_470;
  undefined1 local_461 [9];
  vector<UniValue,_std::allocator<UniValue>_> batch;
  _Optional_payload_base<UniValue> local_440;
  UniValue local_3e0;
  UniValue local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  string local_310 [32];
  string local_2f0;
  string local_2d0;
  string local_2b0;
  int peer_id;
  int64_t addr_rate_limited;
  int64_t addr_processed;
  string result;
  string local_210 [32];
  string local_1f0 [32];
  string local_1d0 [32];
  string local_1b0 [32];
  string local_190 [32];
  double local_170;
  double local_168;
  int64_t local_160;
  int64_t local_158;
  long local_150;
  long local_148;
  long local_140;
  pointer local_138;
  int local_130;
  int local_12c;
  int local_128;
  bool local_124;
  bool local_123;
  bool local_122;
  bool local_121;
  bool local_120;
  size_t max_addr_size;
  array<const_char_*,_3UL> rows;
  vector<signed_char,_std::allocator<signed_char>_> reachable_networks;
  string age;
  string addr;
  string conn_type;
  string network;
  
  lVar5 = *(long *)(in_FS_OFFSET + 0x28);
  JSONRPCProcessBatchReply(&batch,batch_in);
  pUVar29 = batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
            super__Vector_impl_data._M_start;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&result,"error",(allocator<char> *)&network);
  pUVar14 = UniValue::operator[](pUVar29,&result);
  VVar4 = pUVar14->typ;
  std::__cxx11::string::~string((string *)&result);
  pUVar29 = batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (VVar4 == VNULL) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&result,"error",(allocator<char> *)&network);
    pUVar14 = UniValue::operator[](pUVar29 + 1,&result);
    VVar4 = pUVar14->typ;
    std::__cxx11::string::~string((string *)&result);
    pUVar29 = batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (VVar4 != VNULL) {
      batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
      _M_start = batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                 super__Vector_impl_data._M_start + 1;
      goto LAB_0011ffc0;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&result,"result",(allocator<char> *)&network);
    pUVar14 = UniValue::operator[](pUVar29 + 1,&result);
    std::__cxx11::string::~string((string *)&result);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&result,"version",(allocator<char> *)&network);
    pUVar15 = UniValue::operator[](pUVar14,&result);
    iVar13 = UniValue::getInt<int>(pUVar15);
    std::__cxx11::string::~string((string *)&result);
    if (iVar13 < 0x333ec) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this_00,"-netinfo requires bitcoind server to be running v0.21.0 and up");
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar5) {
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_00122415;
    }
    lVar16 = std::chrono::_V2::system_clock::now();
    lVar16 = lVar16 / 1000000000;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&result,"result",(allocator<char> *)&network);
    pUVar15 = UniValue::operator[]
                        (batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                         super__Vector_impl_data._M_start,&result);
    pvVar17 = UniValue::getValues(pUVar15);
    std::__cxx11::string::~string((string *)&result);
    pUVar24 = (pvVar17->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pUVar30 = (pvVar17->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    pUVar29 = (pointer)&this->m_counts;
    this_01 = (this->m_counts)._M_elems + 2;
    args_19 = &this->m_block_relay_peers_count;
    args_15 = &this->m_manual_peers_count;
    this_02 = &this->m_peers;
    args_10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              &this->m_max_addr_processed_length;
    args_12 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              &this->m_max_addr_rate_limited_length;
    args_14 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              &this->m_max_age_length;
    args_18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              &this->m_max_id_length;
    while( true ) {
      if (pUVar24 == pUVar30) break;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&result,"network",(allocator<char> *)&conn_type);
      pUVar15 = UniValue::operator[](pUVar24,&result);
      psVar18 = UniValue::get_str_abi_cxx11_(pUVar15);
      std::__cxx11::string::string((string *)&network,psVar18);
      std::__cxx11::string::~string((string *)&result);
      iVar10 = NetworkStringToId(this,&network);
      if (iVar10 != -1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&result,"inbound",(allocator<char> *)&conn_type);
        pUVar15 = UniValue::operator[](pUVar24,&result);
        bVar11 = UniValue::get_bool(pUVar15);
        std::__cxx11::string::~string((string *)&result);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&result,"relaytxes",(allocator<char> *)&addr);
        pUVar15 = UniValue::operator[](pUVar24,&result);
        if (pUVar15->typ == VNULL) {
          in_stack_fffffffffffffac8 = true;
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&conn_type,"relaytxes",(allocator<char> *)&age);
          pUVar15 = UniValue::operator[](pUVar24,&conn_type);
          in_stack_fffffffffffffac8 = UniValue::get_bool(pUVar15);
          std::__cxx11::string::~string((string *)&conn_type);
        }
        std::__cxx11::string::~string((string *)&result);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&result,"connection_type",(allocator<char> *)&addr);
        pUVar15 = UniValue::operator[](pUVar24,&result);
        psVar18 = UniValue::get_str_abi_cxx11_(pUVar15);
        std::__cxx11::string::string((string *)&conn_type,psVar18);
        in_stack_fffffffffffffac0 = !bVar11;
        std::__cxx11::string::~string((string *)&result);
        uVar22 = (ulong)(byte)in_stack_fffffffffffffac0;
        pvVar19 = std::array<std::array<unsigned_short,_8UL>,_3UL>::at
                            ((array<std::array<unsigned_short,_8UL>,_3UL> *)pUVar29,uVar22);
        sVar25 = (size_type)iVar10;
        pvVar20 = std::array<unsigned_short,_8UL>::at(pvVar19,sVar25);
        *pvVar20 = *pvVar20 + 1;
        pvVar19 = std::array<std::array<unsigned_short,_8UL>,_3UL>::at
                            ((array<std::array<unsigned_short,_8UL>,_3UL> *)pUVar29,uVar22);
        pvVar19->_M_elems[7] = pvVar19->_M_elems[7] + 1;
        pvVar20 = std::array<unsigned_short,_8UL>::at(this_01,sVar25);
        *pvVar20 = *pvVar20 + 1;
        puVar1 = (this->m_counts)._M_elems[2]._M_elems + 7;
        *puVar1 = *puVar1 + 1;
        bVar11 = std::operator==(&conn_type,"block-relay-only");
        if (bVar11) {
          *args_19 = *args_19 + '\x01';
        }
        bVar11 = std::operator==(&conn_type,"manual");
        if (bVar11) {
          *args_15 = *args_15 + '\x01';
        }
        if ((byte)(this->m_details_level - 1) < 4) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&result,"id",(allocator<char> *)&addr);
          pUVar15 = UniValue::operator[](pUVar24,&result);
          iVar13 = UniValue::getInt<int>(pUVar15);
          std::__cxx11::string::~string((string *)&result);
          peer_id = iVar13;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&result,"mapped_as",(allocator<char> *)&age);
          pUVar15 = UniValue::operator[](pUVar24,&result);
          if (pUVar15->typ == VNULL) {
            iVar13 = 0;
            pNVar28 = this;
          }
          else {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&addr,"mapped_as",(allocator<char> *)&reachable_networks);
            pUVar15 = UniValue::operator[](pUVar24,&addr);
            iVar13 = UniValue::getInt<int>(pUVar15);
            std::__cxx11::string::~string((string *)&addr);
            pNVar28 = this;
          }
          std::__cxx11::string::~string((string *)&result);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&result,"version",(allocator<char> *)&addr);
          pUVar15 = UniValue::operator[](pUVar24,&result);
          in_stack_fffffffffffffae0 = UniValue::getInt<int>(pUVar15);
          std::__cxx11::string::~string((string *)&result);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&result,"addr_processed",(allocator<char> *)&age);
          pUVar15 = UniValue::operator[](pUVar24,&result);
          if (pUVar15->typ == VNULL) {
            lVar21 = 0;
          }
          else {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&addr,"addr_processed",(allocator<char> *)&reachable_networks);
            pUVar15 = UniValue::operator[](pUVar24,&addr);
            lVar21 = UniValue::getInt<long>(pUVar15);
            std::__cxx11::string::~string((string *)&addr);
          }
          std::__cxx11::string::~string((string *)&result);
          addr_processed = lVar21;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&result,"addr_rate_limited",(allocator<char> *)&age);
          pUVar15 = UniValue::operator[](pUVar24,&result);
          if (pUVar15->typ == VNULL) {
            lVar21 = 0;
          }
          else {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&addr,"addr_rate_limited",(allocator<char> *)&reachable_networks);
            pUVar15 = UniValue::operator[](pUVar24,&addr);
            lVar21 = UniValue::getInt<long>(pUVar15);
            std::__cxx11::string::~string((string *)&addr);
          }
          std::__cxx11::string::~string((string *)&result);
          addr_rate_limited = lVar21;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&result,"conntime",(allocator<char> *)&addr);
          pUVar15 = UniValue::operator[](pUVar24,&result);
          lVar21 = UniValue::getInt<long>(pUVar15);
          std::__cxx11::string::~string((string *)&result);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&result,"last_block",(allocator<char> *)&addr);
          pUVar15 = UniValue::operator[](pUVar24,&result);
          in_stack_fffffffffffffb38 = UniValue::getInt<long>(pUVar15);
          std::__cxx11::string::~string((string *)&result);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&result,"lastrecv",(allocator<char> *)&addr);
          pUVar15 = UniValue::operator[](pUVar24,&result);
          in_stack_fffffffffffffb30 = UniValue::getInt<long>(pUVar15);
          std::__cxx11::string::~string((string *)&result);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&result,"lastsend",(allocator<char> *)&addr);
          pUVar15 = UniValue::operator[](pUVar24,&result);
          in_stack_fffffffffffffb28 = UniValue::getInt<long>(pUVar15);
          std::__cxx11::string::~string((string *)&result);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&result,"last_transaction",(allocator<char> *)&addr);
          pUVar15 = UniValue::operator[](pUVar24,&result);
          in_stack_fffffffffffffb20 = (pointer)UniValue::getInt<long>(pUVar15);
          std::__cxx11::string::~string((string *)&result);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&result,"minping",(allocator<char> *)&age);
          pUVar15 = UniValue::operator[](pUVar24,&result);
          in_stack_fffffffffffffaa0 = -1.0;
          if (pUVar15->typ != VNULL) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&addr,"minping",(allocator<char> *)&reachable_networks);
            pUVar15 = UniValue::operator[](pUVar24,&addr);
            in_stack_fffffffffffffaa0 = UniValue::get_real(pUVar15);
            std::__cxx11::string::~string((string *)&addr);
          }
          std::__cxx11::string::~string((string *)&result);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&result,"pingtime",(allocator<char> *)&age);
          pUVar15 = UniValue::operator[](pUVar24,&result);
          in_stack_fffffffffffffa98 = -1.0;
          if (pUVar15->typ != VNULL) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&addr,"pingtime",(allocator<char> *)&reachable_networks);
            pUVar15 = UniValue::operator[](pUVar24,&addr);
            in_stack_fffffffffffffa98 = UniValue::get_real(pUVar15);
            std::__cxx11::string::~string((string *)&addr);
          }
          std::__cxx11::string::~string((string *)&result);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&result,"addr",(allocator<char> *)&age);
          pUVar15 = UniValue::operator[](pUVar24,&result);
          psVar18 = UniValue::get_str_abi_cxx11_(pUVar15);
          std::__cxx11::string::string((string *)&addr,psVar18);
          std::__cxx11::string::~string((string *)&result);
          if (lVar21 == 0) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&age,"",(allocator<char> *)&reachable_networks);
          }
          else {
            result._M_dataplus._M_p = (pointer)((lVar16 - lVar21) / 0x3c);
            util::ToString<long>(&age,(long *)&result);
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&result,"subver",(allocator<char> *)&rows);
          pUVar15 = UniValue::operator[](pUVar24,&result);
          psVar18 = UniValue::get_str_abi_cxx11_(pUVar15);
          std::__cxx11::string::string((string *)&reachable_networks,psVar18);
          std::__cxx11::string::~string((string *)&result);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&result,"transport_protocol_type",(allocator<char> *)&local_2b0);
          pUVar15 = UniValue::operator[](pUVar24,&result);
          if (pUVar15->typ == VNULL) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&rows,"v1",(allocator<char> *)&max_addr_size);
          }
          else {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&max_addr_size,"transport_protocol_type",
                       (allocator<char> *)&local_2d0);
            pUVar15 = UniValue::operator[](pUVar24,(string *)&max_addr_size);
            psVar18 = UniValue::get_str_abi_cxx11_(pUVar15);
            std::__cxx11::string::string((string *)&rows,psVar18);
            std::__cxx11::string::~string((string *)&max_addr_size);
          }
          std::__cxx11::string::~string((string *)&result);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&result,"addr_relay_enabled",(allocator<char> *)&local_2b0);
          pUVar15 = UniValue::operator[](pUVar24,&result);
          if (pUVar15->typ == VNULL) {
            in_stack_fffffffffffffab4 = 0;
          }
          else {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&max_addr_size,"addr_relay_enabled",(allocator<char> *)&local_2d0);
            pUVar15 = UniValue::operator[](pUVar24,(string *)&max_addr_size);
            bVar11 = UniValue::get_bool(pUVar15);
            in_stack_fffffffffffffab4 = (undefined4)CONCAT71(extraout_var,bVar11);
            std::__cxx11::string::~string((string *)&max_addr_size);
          }
          std::__cxx11::string::~string((string *)&result);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&result,"bip152_hb_from",(allocator<char> *)&max_addr_size);
          pUVar15 = UniValue::operator[](pUVar24,&result);
          bVar11 = UniValue::get_bool(pUVar15);
          std::__cxx11::string::~string((string *)&result);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&result,"bip152_hb_to",(allocator<char> *)&max_addr_size);
          pUVar15 = UniValue::operator[](pUVar24,&result);
          bVar12 = UniValue::get_bool(pUVar15);
          std::__cxx11::string::~string((string *)&result);
          std::__cxx11::string::string((string *)&result,&addr);
          std::__cxx11::string::string
                    (local_210,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &reachable_networks);
          std::__cxx11::string::string(local_1f0,&conn_type);
          std::__cxx11::string::string<std::allocator<char>>
                    (local_1d0,NETWORK_SHORT_NAMES._M_elems[sVar25],
                     (allocator<char> *)&max_addr_size);
          std::__cxx11::string::string(local_1b0,&age);
          in_stack_fffffffffffffa90 = iVar13;
          std::__cxx11::string::string
                    (local_190,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rows);
          local_160 = addr_processed;
          local_158 = addr_rate_limited;
          local_130 = peer_id;
          local_124 = SUB41(in_stack_fffffffffffffab4,0);
          local_170 = in_stack_fffffffffffffaa0;
          local_168 = in_stack_fffffffffffffa98;
          local_150 = in_stack_fffffffffffffb38;
          local_148 = in_stack_fffffffffffffb30;
          local_140 = in_stack_fffffffffffffb28;
          local_138 = in_stack_fffffffffffffb20;
          local_12c = iVar13;
          local_128 = in_stack_fffffffffffffae0;
          local_123 = bVar11;
          local_122 = bVar12;
          local_121 = (bool)in_stack_fffffffffffffac0;
          local_120 = (bool)in_stack_fffffffffffffac8;
          std::vector<NetinfoRequestHandler::Peer,_std::allocator<NetinfoRequestHandler::Peer>_>::
          emplace_back<NetinfoRequestHandler::Peer>(this_02,(Peer *)&result);
          Peer::~Peer((Peer *)&result);
          uVar22 = addr._M_string_length + 1;
          if (addr._M_string_length + 1 <= pNVar28->m_max_addr_length) {
            uVar22 = pNVar28->m_max_addr_length;
          }
          pNVar28->m_max_addr_length = uVar22;
          util::ToString<long>(&result,&addr_processed);
          pcVar23 = (args_10->_M_dataplus)._M_p;
          if (pcVar23 < result._M_string_length) {
            pcVar23 = (pointer)result._M_string_length;
          }
          (args_10->_M_dataplus)._M_p = pcVar23;
          std::__cxx11::string::~string((string *)&result);
          util::ToString<long>(&result,&addr_rate_limited);
          pcVar23 = (args_12->_M_dataplus)._M_p;
          if (pcVar23 < result._M_string_length) {
            pcVar23 = (pointer)result._M_string_length;
          }
          (args_12->_M_dataplus)._M_p = pcVar23;
          std::__cxx11::string::~string((string *)&result);
          pcVar23 = (args_14->_M_dataplus)._M_p;
          if (pcVar23 < age._M_string_length) {
            pcVar23 = (pointer)age._M_string_length;
          }
          (args_14->_M_dataplus)._M_p = pcVar23;
          util::ToString<int>(&result,&peer_id);
          uVar22 = pNVar28->m_max_id_length;
          if (pNVar28->m_max_id_length < result._M_string_length) {
            uVar22 = result._M_string_length;
          }
          pNVar28->m_max_id_length = uVar22;
          this = pNVar28;
          std::__cxx11::string::~string((string *)&result);
          pNVar28->m_is_asmap_on = (bool)(pNVar28->m_is_asmap_on | iVar13 != 0);
          std::__cxx11::string::~string((string *)&rows);
          std::__cxx11::string::~string((string *)&reachable_networks);
          std::__cxx11::string::~string((string *)&age);
          std::__cxx11::string::~string((string *)&addr);
        }
        std::__cxx11::string::~string((string *)&conn_type);
      }
      std::__cxx11::string::~string((string *)&network);
      pUVar24 = pUVar24 + 1;
    }
    FormatFullVersion_abi_cxx11_();
    ChainToString_abi_cxx11_(&conn_type,this);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&addr,"protocolversion",(allocator<char> *)&rows);
    pUVar15 = UniValue::operator[](pUVar14,&addr);
    iVar13 = UniValue::getInt<int>(pUVar15);
    reachable_networks.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(reachable_networks.
                           super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                           super__Vector_impl_data._M_start._4_4_,iVar13);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&age,"subversion",(allocator<char> *)&max_addr_size);
    pUVar15 = UniValue::operator[](pUVar14,&age);
    pcVar27 = (char *)0x120c99;
    psVar18 = UniValue::get_str_abi_cxx11_(pUVar15);
    tinyformat::format<char[13],std::__cxx11::string,std::__cxx11::string,int,std::__cxx11::string>
              (&result,(tinyformat *)"%s client %s%s - server %i%s\n\n","Bitcoin Core",
               (char (*) [13])&network,&conn_type,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &reachable_networks,(int *)psVar18,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar27);
    std::__cxx11::string::~string((string *)&age);
    std::__cxx11::string::~string((string *)&addr);
    std::__cxx11::string::~string((string *)&conn_type);
    std::__cxx11::string::~string((string *)&network);
    if (((byte)(this->m_details_level - 1) < 4) &&
       ((this->m_peers).
        super__Vector_base<NetinfoRequestHandler::Peer,_std::allocator<NetinfoRequestHandler::Peer>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (this->m_peers).
        super__Vector_base<NetinfoRequestHandler::Peer,_std::allocator<NetinfoRequestHandler::Peer>_>
        ._M_impl.super__Vector_impl_data._M_finish)) {
      std::
      __sort<__gnu_cxx::__normal_iterator<NetinfoRequestHandler::Peer*,std::vector<NetinfoRequestHandler::Peer,std::allocator<NetinfoRequestHandler::Peer>>>,__gnu_cxx::__ops::_Iter_less_iter>
                ();
      tinyformat::format<unsigned_long,char[6],unsigned_long,char[6],unsigned_long,char[4]>
                (&network,(tinyformat *)
                          "<->   type   net  v  mping   ping send recv  txn  blk  hb %*s%*s%*s ",
                 (char *)args_10,(unsigned_long *)"addrp",(char (*) [6])args_12,
                 (unsigned_long *)"addrl",(char (*) [6])args_14,(unsigned_long *)0x197ce9,
                 (char (*) [4])this);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&result,&network);
      args_4 = (char **)0x120d8e;
      std::__cxx11::string::~string((string *)&network);
      if (this->m_is_asmap_on == true) {
        args_4 = (char **)0x120dac;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&result," asmap ");
      }
      bVar11 = (this->m_details_level - 2 & 0xfd) == 0;
      conn_type._M_dataplus._M_p = (pointer)0x0;
      if (bVar11) {
        conn_type._M_dataplus._M_p = (pointer)this->m_max_addr_length;
      }
      psVar18 = &conn_type;
      addr._M_dataplus._M_p = "address";
      if (!bVar11) {
        addr._M_dataplus._M_p = "";
      }
      age._M_dataplus._M_p = "version";
      if (1 < (byte)(this->m_details_level - 3)) {
        age._M_dataplus._M_p = "";
      }
      tinyformat::format<unsigned_long,char[3],unsigned_long,char_const*,char_const*>
                (&network,(tinyformat *)0x196b8b,(char *)args_18,(unsigned_long *)0x1979e5,
                 (char (*) [3])psVar18,(unsigned_long *)&addr,(char **)&age,args_4);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&result,&network);
      std::__cxx11::string::~string((string *)&network);
      __str = (this->m_peers).
              super__Vector_base<NetinfoRequestHandler::Peer,_std::allocator<NetinfoRequestHandler::Peer>_>
              ._M_impl.super__Vector_impl_data._M_start;
      pPVar6 = (this->m_peers).
               super__Vector_base<NetinfoRequestHandler::Peer,_std::allocator<NetinfoRequestHandler::Peer>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      in_stack_fffffffffffffae0 = (int)pPVar6;
      in_stack_fffffffffffffae4 = (undefined4)((ulong)pPVar6 >> 0x20);
      while( true ) {
        if (__str == (pointer)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0)) break;
        util::ToString<int>(&conn_type,&__str->version);
        std::operator+(&network,&conn_type,&__str->sub_version);
        std::__cxx11::string::~string((string *)&conn_type);
        local_461._1_8_ = "connections_in";
        if (__str->is_outbound != false) {
          local_461._1_8_ = "connections_out";
        }
        local_461._1_8_ = local_461._1_8_ + 0xc;
        ConnectionTypeForNetinfo(&addr,this,&__str->conn_type);
        local_461[0] = ' ';
        if (((__str->transport_protocol_type)._M_string_length == 2) &&
           (pcVar27 = (__str->transport_protocol_type)._M_dataplus._M_p, *pcVar27 == 'v')) {
          local_461[0] = pcVar27[1];
        }
        pNVar28 = this;
        PingTimeToString_abi_cxx11_(&age,this,__str->min_ping);
        PingTimeToString_abi_cxx11_((string *)&reachable_networks,this,__str->ping);
        pUVar30 = (pointer)__str->last_send;
        if (pUVar30 == (pointer)0x0) {
          std::__cxx11::string::string<std::allocator<char>>((string *)&rows,"",&local_471);
          this = pNVar28;
        }
        else {
          local_470 = lVar16 - (long)pUVar30;
          util::ToString<long>((string *)&rows,&local_470);
          this = pNVar28;
        }
        lVar21 = __str->last_recv;
        if (lVar21 == 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&max_addr_size,"",(allocator<char> *)&stack0xfffffffffffffb7f);
        }
        else {
          in_stack_fffffffffffffb80 = lVar16 - lVar21;
          util::ToString<long>((string *)&max_addr_size,(long *)&stack0xfffffffffffffb80);
        }
        lVar7 = __str->last_trxn;
        in_stack_fffffffffffffac8 = (undefined1)lVar21;
        in_stack_fffffffffffffac9 = (undefined7)((ulong)lVar21 >> 8);
        if (lVar7 == 0) {
          pcVar27 = "*";
          if (__str->is_tx_relay != false) {
            pcVar27 = "";
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&addr_processed,pcVar27,(allocator<char> *)&stack0xfffffffffffffb6f);
        }
        else {
          in_stack_fffffffffffffb70 = (lVar16 - lVar7) / 0x3c;
          util::ToString<long>((string *)&addr_processed,(long *)&stack0xfffffffffffffb70);
        }
        in_stack_fffffffffffffaa0 = (double)__str->last_blck;
        in_stack_fffffffffffffac0 = (undefined1)lVar7;
        in_stack_fffffffffffffac1 = (undefined7)((ulong)lVar7 >> 8);
        if (in_stack_fffffffffffffaa0 == 0.0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&addr_rate_limited,"",(allocator<char> *)&stack0xfffffffffffffb5f);
        }
        else {
          in_stack_fffffffffffffb60 = (lVar16 - (long)in_stack_fffffffffffffaa0) / 0x3c;
          util::ToString<long>((string *)&addr_rate_limited,(long *)&stack0xfffffffffffffb60);
        }
        args = (char (*) [2])0x1aa174;
        pcVar27 = " ";
        if (__str->is_bip152_hb_to != false) {
          pcVar27 = ".";
        }
        if (__str->is_bip152_hb_from != false) {
          args = (char (*) [2])0x198fba;
        }
        tinyformat::format<char[2],char[2]>
                  ((string *)&peer_id,(tinyformat *)"%s%s",pcVar27,args,(char (*) [2])psVar18);
        in_stack_fffffffffffffa98 = (double)__str->addr_processed;
        if (in_stack_fffffffffffffa98 == 0.0) {
          pcVar27 = ".";
          if (__str->is_addr_relay_enabled != false) {
            pcVar27 = "";
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2b0,pcVar27,(allocator<char> *)&stack0xfffffffffffffb5e);
        }
        else {
          util::ToString<long>(&local_2b0,&__str->addr_processed);
        }
        lVar21 = __str->addr_rate_limited;
        if (lVar21 == 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2d0,"",(allocator<char> *)&stack0xfffffffffffffb5d);
        }
        else {
          util::ToString<long>(&local_2d0,&__str->addr_rate_limited);
        }
        in_stack_fffffffffffffb58 = 0;
        if (this->m_is_asmap_on != false) {
          in_stack_fffffffffffffb58 = 7;
        }
        in_stack_fffffffffffffa90 = (int)lVar21;
        in_stack_fffffffffffffa94 = (undefined4)((ulong)lVar21 >> 0x20);
        if ((this->m_is_asmap_on == true) && (__str->mapped_as != 0)) {
          util::ToString<int>(&local_2f0,&__str->mapped_as);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2f0,"",(allocator<char> *)&stack0xfffffffffffffb57);
        }
        uVar2 = this->m_details_level;
        if ((uVar2 - 2 & 0xfd) == 0) {
          in_stack_fffffffffffffb48 = this->m_max_addr_length;
        }
        else {
          in_stack_fffffffffffffb48 = 0;
        }
        if ((uVar2 == '\x04') || (uVar2 == '\x02')) {
          std::__cxx11::string::string(local_310,&__str->addr);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    (local_310,"",(allocator<char> *)&stack0xfffffffffffffb47);
        }
        if ((1 < (byte)(this->m_details_level - 3)) ||
           (bVar11 = std::operator==(&network,"0"), bVar11)) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_330,"",(allocator<char> *)&stack0xfffffffffffffb46);
        }
        else {
          std::__cxx11::string::string((string *)&local_330,&network);
        }
        psVar18 = &__str->network;
        tinyformat::
        format<char_const*,std::__cxx11::string,std::__cxx11::string,char,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,unsigned_long,std::__cxx11::string,unsigned_long,std::__cxx11::string,unsigned_long,std::__cxx11::string,int,std::__cxx11::string,unsigned_long,int,unsigned_long,std::__cxx11::string,std::__cxx11::string>
                  (&conn_type,
                   (tinyformat *)"%3s %6s %5s %2s%7s%7s%5s%5s%5s%5s  %2s %*s%*s%*s%*i %*s %-*s%s\n",
                   local_461 + 1,(char **)&addr,psVar18,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_461,
                   (char *)&age,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &reachable_networks,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rows,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &max_addr_size,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &addr_processed,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &addr_rate_limited,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&peer_id,
                   args_10,(unsigned_long *)&local_2b0,args_12,(unsigned_long *)&local_2d0,args_14,
                   (unsigned_long *)&__str->age,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xfffffffffffffb58,(int *)&local_2f0,args_18,(unsigned_long *)&__str->id,
                   (int *)&stack0xfffffffffffffb48,(unsigned_long *)local_310,&local_330,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&result,&conn_type);
        std::__cxx11::string::~string((string *)&conn_type);
        std::__cxx11::string::~string((string *)&local_330);
        std::__cxx11::string::~string(local_310);
        std::__cxx11::string::~string((string *)&local_2f0);
        std::__cxx11::string::~string((string *)&local_2d0);
        std::__cxx11::string::~string((string *)&local_2b0);
        std::__cxx11::string::~string((string *)&peer_id);
        std::__cxx11::string::~string((string *)&addr_rate_limited);
        std::__cxx11::string::~string((string *)&addr_processed);
        std::__cxx11::string::~string((string *)&max_addr_size);
        std::__cxx11::string::~string((string *)&rows);
        std::__cxx11::string::~string((string *)&reachable_networks);
        std::__cxx11::string::~string((string *)&age);
        std::__cxx11::string::~string((string *)&addr);
        std::__cxx11::string::~string((string *)&network);
        __str = __str + 1;
      }
      pcVar27 = "min";
      tinyformat::format<unsigned_long,char[4]>
                (&network,(tinyformat *)
                          "                        ms     ms  sec  sec  min  min                %*s\n\n"
                 ,(char *)args_14,(unsigned_long *)"min",(char (*) [4])psVar18);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&result,&network);
      std::__cxx11::string::~string((string *)&network);
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&result,"     ");
    reachable_networks.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    reachable_networks.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    reachable_networks.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&network,"networks",(allocator<char> *)&conn_type);
    pUVar15 = UniValue::operator[](pUVar14,&network);
    pvVar17 = UniValue::getValues(pUVar15);
    std::__cxx11::string::~string((string *)&network);
    pUVar8 = (pvVar17->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (pUVar24 = (pvVar17->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
                   super__Vector_impl_data._M_start; pUVar24 != pUVar8; pUVar24 = pUVar24 + 1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&network,"reachable",(allocator<char> *)&conn_type);
      pUVar15 = UniValue::operator[](pUVar24,&network);
      bVar11 = UniValue::get_bool(pUVar15);
      std::__cxx11::string::~string((string *)&network);
      if (bVar11) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&network,"name",(allocator<char> *)&conn_type);
        pUVar15 = UniValue::operator[](pUVar24,&network);
        psVar18 = UniValue::get_str_abi_cxx11_(pUVar15);
        std::__cxx11::string::~string((string *)&network);
        iVar10 = NetworkStringToId(this,psVar18);
        conn_type._M_dataplus._M_p._0_1_ = iVar10;
        if (iVar10 != -1) {
          tinyformat::format<std::__cxx11::string>
                    (&network,(tinyformat *)"%8s",(char *)psVar18,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar27);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (&result,&network);
          std::__cxx11::string::~string((string *)&network);
          std::vector<signed_char,_std::allocator<signed_char>_>::push_back
                    (&reachable_networks,(value_type *)&conn_type);
        }
      }
    }
    for (lVar21 = 0; lVar21 != 8; lVar21 = lVar21 + 4) {
      iVar13 = *(int *)((long)UNREACHABLE_NETWORK_IDS._M_elems + lVar21);
      pvVar20 = std::array<unsigned_short,_8UL>::at(this_01,(long)iVar13);
      if (*pvVar20 != 0) {
        fmt = std::array<const_char_*,_7UL>::at(&NETWORK_SHORT_NAMES,(long)iVar13);
        tinyformat::format<char_const*>(&network,(tinyformat *)"%8s",(char *)fmt,(char **)pcVar27);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&result,&network);
        std::__cxx11::string::~string((string *)&network);
        network._M_dataplus._M_p._0_1_ = (char)iVar13;
        std::vector<signed_char,_std::allocator<signed_char>_>::emplace_back<signed_char>
                  (&reachable_networks,(char *)&network);
      }
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&result,"   total   block");
    if (*args_15 != '\0') {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&result,"  manual");
    }
    rows._M_elems[2] = "total";
    rows._M_elems[0] = "in";
    rows._M_elems[1] = "out";
    for (sVar25 = 0; sVar25 != 3; sVar25 = sVar25 + 1) {
      tinyformat::format<char_const*>
                (&network,(tinyformat *)"\n%-5s",(char *)(rows._M_elems + sVar25),(char **)pcVar27);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&result,&network);
      std::__cxx11::string::~string((string *)&network);
      pcVar9 = reachable_networks.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      for (pcVar26 = reachable_networks.
                     super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                     super__Vector_impl_data._M_start; pcVar26 != pcVar9; pcVar26 = pcVar26 + 1) {
        cVar3 = *pcVar26;
        pvVar19 = std::array<std::array<unsigned_short,_8UL>,_3UL>::at
                            ((array<std::array<unsigned_short,_8UL>,_3UL> *)pUVar29,sVar25);
        pvVar20 = std::array<unsigned_short,_8UL>::at(pvVar19,(long)cVar3);
        tinyformat::format<unsigned_short>(&network,"%8i",pvVar20);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&result,&network);
        std::__cxx11::string::~string((string *)&network);
      }
      pvVar19 = std::array<std::array<unsigned_short,_8UL>,_3UL>::at
                          ((array<std::array<unsigned_short,_8UL>,_3UL> *)pUVar29,sVar25);
      tinyformat::format<unsigned_short>(&network,"   %5i",pvVar19->_M_elems + 7);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&result,&network);
      std::__cxx11::string::~string((string *)&network);
      if (sVar25 == 1) {
        tinyformat::format<unsigned_char>(&network,"   %5i",args_19);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&result,&network);
        std::__cxx11::string::~string((string *)&network);
        if (*args_15 != '\0') {
          tinyformat::format<unsigned_char>(&network,"   %5i",args_15);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (&result,&network);
          std::__cxx11::string::~string((string *)&network);
        }
      }
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&result,"\n\nLocal addresses");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&network,"localaddresses",(allocator<char> *)&conn_type);
    pUVar15 = UniValue::operator[](pUVar14,&network);
    pvVar17 = UniValue::getValues(pUVar15);
    std::__cxx11::string::~string((string *)&network);
    pUVar24 = (pvVar17->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pUVar8 = (pvVar17->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (pUVar24 == pUVar8) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&result,": n/a\n");
    }
    else {
      max_addr_size = 0;
      for (; pUVar24 != pUVar8; pUVar24 = pUVar24 + 1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&network,"address",(allocator<char> *)&conn_type);
        pUVar15 = UniValue::operator[](pUVar24,&network);
        psVar18 = UniValue::get_str_abi_cxx11_(pUVar15);
        uVar22 = psVar18->_M_string_length + 1;
        if (uVar22 <= max_addr_size) {
          uVar22 = max_addr_size;
        }
        max_addr_size = uVar22;
        std::__cxx11::string::~string((string *)&network);
      }
      pUVar29 = (pvVar17->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      for (pUVar24 = (pvVar17->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
                     super__Vector_impl_data._M_start; pUVar24 != pUVar29; pUVar24 = pUVar24 + 1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&conn_type,"address",(allocator<char> *)&peer_id);
        pUVar15 = UniValue::operator[](pUVar24,&conn_type);
        psVar18 = UniValue::get_str_abi_cxx11_(pUVar15);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&addr,"port",(allocator<char> *)&local_2b0);
        pUVar15 = UniValue::operator[](pUVar24,&addr);
        iVar13 = UniValue::getInt<int>(pUVar15);
        addr_processed = CONCAT44(addr_processed._4_4_,iVar13);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&age,"score",(allocator<char> *)&local_2d0);
        pUVar15 = UniValue::operator[](pUVar24,&age);
        iVar13 = UniValue::getInt<int>(pUVar15);
        addr_rate_limited = CONCAT44(addr_rate_limited._4_4_,iVar13);
        tinyformat::format<unsigned_long,std::__cxx11::string,int,int>
                  (&network,(tinyformat *)"\n%-*s    port %6i    score %6i",(char *)&max_addr_size,
                   (unsigned_long *)psVar18,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &addr_processed,(int *)&addr_rate_limited,(int *)this);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&result,&network);
        std::__cxx11::string::~string((string *)&network);
        std::__cxx11::string::~string((string *)&age);
        std::__cxx11::string::~string((string *)&addr);
        std::__cxx11::string::~string((string *)&conn_type);
      }
    }
    UniValue::
    UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (&local_388,&result);
    UniValue::UniValue(&local_3e0,&NullUniValue);
    network._M_dataplus._M_p._0_4_ = 1;
    std::_Optional_payload_base<UniValue>::_Optional_payload_base<int>(&local_440);
    result_00.val._M_dataplus._M_p = (pointer)pUVar29;
    result_00._0_8_ = this;
    result_00.val._M_string_length = (size_type)pUVar14;
    result_00.val.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffffa90;
    result_00.val.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffffa94;
    result_00.val.field_2._8_8_ = in_stack_fffffffffffffa98;
    result_00.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffaa0;
    result_00.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)lVar16;
    result_00.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = in_stack_fffffffffffffab0;
    result_00.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = in_stack_fffffffffffffab4;
    result_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)args_14;
    result_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish._0_1_ = in_stack_fffffffffffffac0;
    result_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish._1_7_ = in_stack_fffffffffffffac1;
    result_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_1_ = in_stack_fffffffffffffac8;
    result_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._1_7_ = in_stack_fffffffffffffac9;
    error.val._M_dataplus._M_p = (pointer)args_15;
    error._0_8_ = pUVar30;
    error.val._M_string_length._0_4_ = in_stack_fffffffffffffae0;
    error.val._M_string_length._4_4_ = in_stack_fffffffffffffae4;
    error.val.field_2._M_allocated_capacity = (size_type)args_12;
    error.val.field_2._8_8_ = args_10;
    error.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)__return_storage_ptr__;
    error.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = args_18;
    error.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)args_19;
    error.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)this_01;
    error.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)this_02;
    error.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffffb20;
    id.super__Optional_base<UniValue,_false,_false>._M_payload.
    super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
    _M_payload._M_value.val._M_dataplus._M_p = (_Alloc_hider)(_Alloc_hider)in_stack_fffffffffffffb30
    ;
    id.super__Optional_base<UniValue,_false,_false>._M_payload.
    super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
    _M_payload._0_8_ = in_stack_fffffffffffffb28;
    id.super__Optional_base<UniValue,_false,_false>._M_payload.
    super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
    _M_payload._M_value.val._M_string_length = in_stack_fffffffffffffb38;
    id.super__Optional_base<UniValue,_false,_false>._M_payload.
    super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
    _M_payload._24_8_ = in_stack_fffffffffffffb40;
    id.super__Optional_base<UniValue,_false,_false>._M_payload.
    super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
    _M_payload._32_8_ = in_stack_fffffffffffffb48;
    id.super__Optional_base<UniValue,_false,_false>._M_payload.
    super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
    _M_payload._M_value.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffb50;
    id.super__Optional_base<UniValue,_false,_false>._M_payload.
    super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
    _M_payload._48_4_ = in_stack_fffffffffffffb58;
    id.super__Optional_base<UniValue,_false,_false>._M_payload.
    super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
    _M_payload._52_4_ = in_stack_fffffffffffffb5c;
    id.super__Optional_base<UniValue,_false,_false>._M_payload.
    super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
    _M_payload._M_value.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffb60;
    id.super__Optional_base<UniValue,_false,_false>._M_payload.
    super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
    _M_payload._M_value.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffb68;
    id.super__Optional_base<UniValue,_false,_false>._M_payload.
    super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
    _M_payload._M_value.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffb70;
    id.super__Optional_base<UniValue,_false,_false>._M_payload.
    super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
    _M_payload._M_value.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffb78;
    id.super__Optional_base<UniValue,_false,_false>._M_payload.
    super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
    _88_8_ = in_stack_fffffffffffffb80;
    JSONRPCReplyObj(__return_storage_ptr__,result_00,error,id,(JSONRPCVersion)&local_388);
    std::_Optional_payload_base<UniValue>::_M_reset(&local_440);
    UniValue::~UniValue(&local_3e0);
    UniValue::~UniValue(&local_388);
    std::_Vector_base<signed_char,_std::allocator<signed_char>_>::~_Vector_base
              (&reachable_networks.super__Vector_base<signed_char,_std::allocator<signed_char>_>);
    std::__cxx11::string::~string((string *)&result);
  }
  else {
LAB_0011ffc0:
    UniValue::UniValue(__return_storage_ptr__,
                       batch.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                       super__Vector_impl_data._M_start);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&batch);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar5) {
    return __return_storage_ptr__;
  }
LAB_00122415:
  __stack_chk_fail();
}

Assistant:

UniValue ProcessReply(const UniValue& batch_in) override
    {
        const std::vector<UniValue> batch{JSONRPCProcessBatchReply(batch_in)};
        if (!batch[ID_PEERINFO]["error"].isNull()) return batch[ID_PEERINFO];
        if (!batch[ID_NETWORKINFO]["error"].isNull()) return batch[ID_NETWORKINFO];

        const UniValue& networkinfo{batch[ID_NETWORKINFO]["result"]};
        if (networkinfo["version"].getInt<int>() < 209900) {
            throw std::runtime_error("-netinfo requires bitcoind server to be running v0.21.0 and up");
        }
        const int64_t time_now{TicksSinceEpoch<std::chrono::seconds>(CliClock::now())};

        // Count peer connection totals, and if DetailsRequested(), store peer data in a vector of structs.
        for (const UniValue& peer : batch[ID_PEERINFO]["result"].getValues()) {
            const std::string network{peer["network"].get_str()};
            const int8_t network_id{NetworkStringToId(network)};
            if (network_id == UNKNOWN_NETWORK) continue;
            const bool is_outbound{!peer["inbound"].get_bool()};
            const bool is_tx_relay{peer["relaytxes"].isNull() ? true : peer["relaytxes"].get_bool()};
            const std::string conn_type{peer["connection_type"].get_str()};
            ++m_counts.at(is_outbound).at(network_id);      // in/out by network
            ++m_counts.at(is_outbound).at(NETWORKS.size()); // in/out overall
            ++m_counts.at(2).at(network_id);                // total by network
            ++m_counts.at(2).at(NETWORKS.size());           // total overall
            if (conn_type == "block-relay-only") ++m_block_relay_peers_count;
            if (conn_type == "manual") ++m_manual_peers_count;
            if (DetailsRequested()) {
                // Push data for this peer to the peers vector.
                const int peer_id{peer["id"].getInt<int>()};
                const int mapped_as{peer["mapped_as"].isNull() ? 0 : peer["mapped_as"].getInt<int>()};
                const int version{peer["version"].getInt<int>()};
                const int64_t addr_processed{peer["addr_processed"].isNull() ? 0 : peer["addr_processed"].getInt<int64_t>()};
                const int64_t addr_rate_limited{peer["addr_rate_limited"].isNull() ? 0 : peer["addr_rate_limited"].getInt<int64_t>()};
                const int64_t conn_time{peer["conntime"].getInt<int64_t>()};
                const int64_t last_blck{peer["last_block"].getInt<int64_t>()};
                const int64_t last_recv{peer["lastrecv"].getInt<int64_t>()};
                const int64_t last_send{peer["lastsend"].getInt<int64_t>()};
                const int64_t last_trxn{peer["last_transaction"].getInt<int64_t>()};
                const double min_ping{peer["minping"].isNull() ? -1 : peer["minping"].get_real()};
                const double ping{peer["pingtime"].isNull() ? -1 : peer["pingtime"].get_real()};
                const std::string addr{peer["addr"].get_str()};
                const std::string age{conn_time == 0 ? "" : ToString((time_now - conn_time) / 60)};
                const std::string sub_version{peer["subver"].get_str()};
                const std::string transport{peer["transport_protocol_type"].isNull() ? "v1" : peer["transport_protocol_type"].get_str()};
                const bool is_addr_relay_enabled{peer["addr_relay_enabled"].isNull() ? false : peer["addr_relay_enabled"].get_bool()};
                const bool is_bip152_hb_from{peer["bip152_hb_from"].get_bool()};
                const bool is_bip152_hb_to{peer["bip152_hb_to"].get_bool()};
                m_peers.push_back({addr, sub_version, conn_type, NETWORK_SHORT_NAMES[network_id], age, transport, min_ping, ping, addr_processed, addr_rate_limited, last_blck, last_recv, last_send, last_trxn, peer_id, mapped_as, version, is_addr_relay_enabled, is_bip152_hb_from, is_bip152_hb_to, is_outbound, is_tx_relay});
                m_max_addr_length = std::max(addr.length() + 1, m_max_addr_length);
                m_max_addr_processed_length = std::max(ToString(addr_processed).length(), m_max_addr_processed_length);
                m_max_addr_rate_limited_length = std::max(ToString(addr_rate_limited).length(), m_max_addr_rate_limited_length);
                m_max_age_length = std::max(age.length(), m_max_age_length);
                m_max_id_length = std::max(ToString(peer_id).length(), m_max_id_length);
                m_is_asmap_on |= (mapped_as != 0);
            }
        }

        // Generate report header.
        std::string result{strprintf("%s client %s%s - server %i%s\n\n", PACKAGE_NAME, FormatFullVersion(), ChainToString(), networkinfo["protocolversion"].getInt<int>(), networkinfo["subversion"].get_str())};

        // Report detailed peer connections list sorted by direction and minimum ping time.
        if (DetailsRequested() && !m_peers.empty()) {
            std::sort(m_peers.begin(), m_peers.end());
            result += strprintf("<->   type   net  v  mping   ping send recv  txn  blk  hb %*s%*s%*s ",
                                m_max_addr_processed_length, "addrp",
                                m_max_addr_rate_limited_length, "addrl",
                                m_max_age_length, "age");
            if (m_is_asmap_on) result += " asmap ";
            result += strprintf("%*s %-*s%s\n", m_max_id_length, "id", IsAddressSelected() ? m_max_addr_length : 0, IsAddressSelected() ? "address" : "", IsVersionSelected() ? "version" : "");
            for (const Peer& peer : m_peers) {
                std::string version{ToString(peer.version) + peer.sub_version};
                result += strprintf(
                    "%3s %6s %5s %2s%7s%7s%5s%5s%5s%5s  %2s %*s%*s%*s%*i %*s %-*s%s\n",
                    peer.is_outbound ? "out" : "in",
                    ConnectionTypeForNetinfo(peer.conn_type),
                    peer.network,
                    (peer.transport_protocol_type.size() == 2 && peer.transport_protocol_type[0] == 'v') ? peer.transport_protocol_type[1] : ' ',
                    PingTimeToString(peer.min_ping),
                    PingTimeToString(peer.ping),
                    peer.last_send ? ToString(time_now - peer.last_send) : "",
                    peer.last_recv ? ToString(time_now - peer.last_recv) : "",
                    peer.last_trxn ? ToString((time_now - peer.last_trxn) / 60) : peer.is_tx_relay ? "" : "*",
                    peer.last_blck ? ToString((time_now - peer.last_blck) / 60) : "",
                    strprintf("%s%s", peer.is_bip152_hb_to ? "." : " ", peer.is_bip152_hb_from ? "*" : " "),
                    m_max_addr_processed_length, // variable spacing
                    peer.addr_processed ? ToString(peer.addr_processed) : peer.is_addr_relay_enabled ? "" : ".",
                    m_max_addr_rate_limited_length, // variable spacing
                    peer.addr_rate_limited ? ToString(peer.addr_rate_limited) : "",
                    m_max_age_length, // variable spacing
                    peer.age,
                    m_is_asmap_on ? 7 : 0, // variable spacing
                    m_is_asmap_on && peer.mapped_as ? ToString(peer.mapped_as) : "",
                    m_max_id_length, // variable spacing
                    peer.id,
                    IsAddressSelected() ? m_max_addr_length : 0, // variable spacing
                    IsAddressSelected() ? peer.addr : "",
                    IsVersionSelected() && version != "0" ? version : "");
            }
            result += strprintf("                        ms     ms  sec  sec  min  min                %*s\n\n", m_max_age_length, "min");
        }

        // Report peer connection totals by type.
        result += "     ";
        std::vector<int8_t> reachable_networks;
        for (const UniValue& network : networkinfo["networks"].getValues()) {
            if (network["reachable"].get_bool()) {
                const std::string& network_name{network["name"].get_str()};
                const int8_t network_id{NetworkStringToId(network_name)};
                if (network_id == UNKNOWN_NETWORK) continue;
                result += strprintf("%8s", network_name); // column header
                reachable_networks.push_back(network_id);
            }
        };

        for (const size_t network_id : UNREACHABLE_NETWORK_IDS) {
            if (m_counts.at(2).at(network_id) == 0) continue;
            result += strprintf("%8s", NETWORK_SHORT_NAMES.at(network_id)); // column header
            reachable_networks.push_back(network_id);
        }

        result += "   total   block";
        if (m_manual_peers_count) result += "  manual";

        const std::array rows{"in", "out", "total"};
        for (size_t i = 0; i < rows.size(); ++i) {
            result += strprintf("\n%-5s", rows[i]); // row header
            for (int8_t n : reachable_networks) {
                result += strprintf("%8i", m_counts.at(i).at(n)); // network peers count
            }
            result += strprintf("   %5i", m_counts.at(i).at(NETWORKS.size())); // total peers count
            if (i == 1) { // the outbound row has two extra columns for block relay and manual peer counts
                result += strprintf("   %5i", m_block_relay_peers_count);
                if (m_manual_peers_count) result += strprintf("   %5i", m_manual_peers_count);
            }
        }

        // Report local addresses, ports, and scores.
        result += "\n\nLocal addresses";
        const std::vector<UniValue>& local_addrs{networkinfo["localaddresses"].getValues()};
        if (local_addrs.empty()) {
            result += ": n/a\n";
        } else {
            size_t max_addr_size{0};
            for (const UniValue& addr : local_addrs) {
                max_addr_size = std::max(addr["address"].get_str().length() + 1, max_addr_size);
            }
            for (const UniValue& addr : local_addrs) {
                result += strprintf("\n%-*s    port %6i    score %6i", max_addr_size, addr["address"].get_str(), addr["port"].getInt<int>(), addr["score"].getInt<int>());
            }
        }

        return JSONRPCReplyObj(UniValue{result}, NullUniValue, /*id=*/1, JSONRPCVersion::V2);
    }